

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

void mg_send_file_internal
               (mg_connection *c,char *file_name,file_stat_t *st,int exists,char *extra_headers)

{
  byte bVar1;
  int iVar2;
  void *pvVar3;
  ulong uVar4;
  undefined8 uVar5;
  dir_entry *__ptr;
  int iVar6;
  __pid_t _Var7;
  uint uVar8;
  size_t sVar9;
  char *pcVar10;
  __int32_t **pp_Var11;
  char *pcVar12;
  FILE *__stream;
  byte *pbVar13;
  ns_connection *pnVar14;
  tm *__tp;
  int *piVar15;
  long lVar16;
  char *pcVar17;
  connection *conn_00;
  size_t sVar18;
  connection *conn;
  ulong uVar19;
  long lVar20;
  __time_t *__timer;
  undefined4 uVar21;
  int local_a26c;
  int day;
  int hour;
  connection *local_a260;
  char *local_a258;
  int minute;
  int iStack_a24c;
  file_stat_t *local_a248;
  char *local_a240;
  char mod [64];
  char cStack_a039;
  char path [8192];
  char size [64];
  file_stat_t st_1;
  undefined8 local_4030 [64];
  undefined8 local_3e30;
  
  uVar8 = st->st_mode;
  conn_00 = (connection *)&c[-1].callback_param;
  local_a258 = *(char **)(c[1].request_method + 0x58);
  lVar20 = *(long *)(c[1].request_method + 0x70);
  local_a248 = st;
  local_a240 = extra_headers;
  mg_snprintf(path,0x2000,"%s");
  if (exists != 0) {
    pcVar10 = c[1].request_method;
    iVar6 = must_hide_file(*(connection **)(pcVar10 + 0x90),path);
    if (iVar6 == 0) {
      local_a260 = conn_00;
      if ((uVar8 & 0xf000) == 0x4000) {
        pcVar17 = c->uri;
        sVar9 = strlen(pcVar17);
        if (pcVar17[sVar9 - 1] != '/') {
          c->status_code = 0x12d;
          mg_printf(c,"HTTP/1.1 301 Moved Permanently\r\nLocation: %s/\r\n\r\n",pcVar17);
LAB_00108d31:
          close_local_endpoint(conn_00);
          return;
        }
        pcVar10 = *(char **)(pcVar10 + 0xa0);
        for (sVar9 = strlen(path); sVar9 != 0; sVar9 = sVar9 - 1) {
          if (path[sVar9 - 1] != '/') goto LAB_00108128;
        }
        sVar9 = 0;
LAB_00108128:
        path[sVar9] = '/';
        pcVar10 = next_option(pcVar10,(vec *)size,(vec *)0x0);
        if (pcVar10 != (char *)0x0) {
          do {
            sVar18 = (size_t)(int)size._8_4_;
            if ((int)size._8_4_ <= 0x1ffe - (int)sVar9) {
              strncpy(path + sVar9 + 1,(char *)size._0_8_,sVar18);
              (path + sVar9 + 1)[sVar18] = '\0';
              iVar6 = stat64(path,(stat64 *)&st_1);
              if (iVar6 == 0) {
                memcpy(local_a248,&st_1,0x90);
                goto LAB_0010826b;
              }
            }
            pcVar10 = next_option(pcVar10,(vec *)size,(vec *)0x0);
          } while (pcVar10 != (char *)0x0);
        }
        path[sVar9] = '\0';
        pp_Var11 = __ctype_tolower_loc();
        conn_00 = local_a260;
        lVar16 = 0;
        do {
          bVar1 = *(byte *)(lVar20 + lVar16);
          iVar6 = (*pp_Var11)[bVar1];
          iVar2 = (*pp_Var11)[(byte)"yes"[lVar16]];
          if (bVar1 == 0) break;
          lVar16 = lVar16 + 1;
        } while (iVar6 == iVar2);
        if (iVar6 == iVar2) {
          _minute = (dir_entry *)0x0;
          if (c->query_string == (char *)0x0) {
            uVar19 = 100;
          }
          else {
            uVar19 = (ulong)((uint)(c->query_string[1] != 'd') * 3 + 0x61);
          }
          mg_send_header(c,"Transfer-Encoding","chunked");
          mg_send_header(c,"Content-Type","text/html; charset=utf-8");
          mg_printf_data(c,
                         "<html><head><title>Index of %s</title><style>th {text-align: left;}</style></head><body><h1>Index of %s</h1><pre><table cellpadding=\"0\"><tr><th><a href=\"?n%c\">Name</a></th><th><a href=\"?d%c\">Modified</a></th><th><a href=\"?s%c\">Size</a></th></tr><tr><td colspan=\"3\"><hr></td></tr>"
                         ,c->uri,c->uri,uVar19,uVar19,uVar19);
          uVar8 = scan_directory(conn_00,path,(dir_entry **)&minute);
          __ptr = _minute;
          qsort(_minute,(long)(int)uVar8,0xa0,compare_dir_entries);
          if (0 < (int)uVar8) {
            uVar19 = (ulong)uVar8;
            __timer = &(__ptr->st).st_mtime;
            do {
              if ((*(uint *)(__timer + -8) & 0xf000) == 0x4000) {
                mg_snprintf(size,0x40,"%s","[DIRECTORY]");
                pcVar10 = "/";
              }
              else {
                uVar4 = __timer[-5];
                if ((long)uVar4 < 0x400) {
                  mg_snprintf(size,0x40,"%d");
                }
                else {
                  if (uVar4 < 0x100000) {
                    uVar21 = SUB84((double)(long)uVar4 * 0.0009765625,0);
                    pcVar10 = "%.1fk";
                  }
                  else if (uVar4 < 0x40000000) {
                    uVar21 = SUB84((double)(long)uVar4 * 9.5367431640625e-07,0);
                    pcVar10 = "%.1fM";
                  }
                  else {
                    uVar21 = SUB84((double)(long)uVar4 * 9.313225746154785e-10,0);
                    pcVar10 = "%.1fG";
                  }
                  mg_snprintf(size,0x40,pcVar10,uVar21);
                }
                pcVar10 = "";
              }
              __tp = localtime(__timer);
              strftime(mod,0x40,"%d-%b-%Y %H:%M",__tp);
              pcVar17 = (char *)__timer[-0xc];
              sVar9 = strlen(pcVar17);
              mg_url_encode(pcVar17,sVar9,(char *)&st_1,0x6000);
              mg_printf_data((mg_connection *)(__timer[-0xd] + 8),
                             "<tr><td><a href=\"%s%s\">%s%s</a></td><td>&nbsp;%s</td><td>&nbsp;&nbsp;%s</td></tr>\n"
                             ,&st_1,pcVar10,pcVar17,pcVar10,mod,size);
              free((void *)__timer[-0xc]);
              __timer = __timer + 0x14;
              uVar19 = uVar19 - 1;
              conn_00 = local_a260;
            } while (uVar19 != 0);
          }
          free(__ptr);
          ns_out(conn_00->ns_conn,"0\r\n\r\n",5);
          goto LAB_00108d31;
        }
        iVar6 = 0x193;
        goto LAB_001080ac;
      }
LAB_0010826b:
      pcVar10 = local_a258;
      sVar9 = strlen(local_a258);
      iVar6 = mg_match_prefix(pcVar10,(int)sVar9,path);
      if (0 < iVar6) {
        pcVar10 = c[1].request_method;
        local_3e30._0_4_ = 0;
        local_3e30._4_4_ = 0;
        st_1.st_dev = (__dev_t)c;
        pcVar12 = getenv("SERVER_NAME");
        pcVar17 = c->local_ip;
        if (pcVar12 != (char *)0x0) {
          pcVar17 = pcVar12;
        }
        addenv((cgi_env_block *)&st_1,"SERVER_NAME=%s",pcVar17);
        addenv((cgi_env_block *)&st_1,"SERVER_ROOT=%s",*(undefined8 *)(pcVar10 + 0x68));
        addenv((cgi_env_block *)&st_1,"DOCUMENT_ROOT=%s",*(undefined8 *)(pcVar10 + 0x68));
        addenv((cgi_env_block *)&st_1,"SERVER_SOFTWARE=%s/%s","Mongoose","5.4");
        addenv((cgi_env_block *)&st_1,"%s","GATEWAY_INTERFACE=CGI/1.1");
        addenv((cgi_env_block *)&st_1,"%s","SERVER_PROTOCOL=HTTP/1.1");
        addenv((cgi_env_block *)&st_1,"%s","REDIRECT_STATUS=200");
        addenv((cgi_env_block *)&st_1,"REQUEST_METHOD=%s",c->request_method);
        addenv((cgi_env_block *)&st_1,"REMOTE_ADDR=%s",c->remote_ip);
        addenv((cgi_env_block *)&st_1,"REMOTE_PORT=%d",(ulong)c->remote_port);
        pcVar10 = c->query_string;
        pcVar17 = "?";
        if (pcVar10 == (char *)0x0) {
          pcVar17 = "";
        }
        local_a258 = "";
        if (pcVar10 == (char *)0x0) {
          pcVar10 = "";
        }
        addenv((cgi_env_block *)&st_1,"REQUEST_URI=%s%s%s",c->uri,pcVar17,pcVar10);
        pcVar10 = c[1].query_string;
        if (pcVar10 == (char *)0x0) {
          pcVar17 = strrchr(path,0x2f);
          pcVar10 = c->uri;
          pcVar12 = strrchr(pcVar10,0x2f);
          uVar19 = (ulong)(uint)((int)pcVar12 - (int)pcVar10);
          if (pcVar12 == (char *)0x0) {
            uVar19 = 0;
          }
          if (pcVar17 == (char *)0x0) {
            pcVar17 = path;
          }
          addenv((cgi_env_block *)&st_1,"SCRIPT_NAME=%.*s%s",uVar19,pcVar10,pcVar17);
        }
        else {
          pcVar17 = c->uri;
          sVar9 = strlen(pcVar17);
          sVar18 = strlen(pcVar10);
          addenv((cgi_env_block *)&st_1,"SCRIPT_NAME=%.*s",(ulong)(uint)((int)sVar9 - (int)sVar18),
                 pcVar17);
          addenv((cgi_env_block *)&st_1,"PATH_INFO=%s",c[1].query_string);
        }
        addenv((cgi_env_block *)&st_1,"SCRIPT_FILENAME=%s",path);
        addenv((cgi_env_block *)&st_1,"PATH_TRANSLATED=%s",path);
        pcVar10 = "on";
        if (*(long *)((long)c[-1].callback_param + 0x68) == 0) {
          pcVar10 = "off";
        }
        addenv((cgi_env_block *)&st_1,"HTTPS=%s",pcVar10);
        pcVar10 = mg_get_header(c,"Content-Type");
        if (pcVar10 != (char *)0x0) {
          addenv((cgi_env_block *)&st_1,"CONTENT_TYPE=%s",pcVar10);
        }
        if (c->query_string != (char *)0x0) {
          addenv((cgi_env_block *)&st_1,"QUERY_STRING=%s");
        }
        pcVar10 = mg_get_header(c,"Content-Length");
        if (pcVar10 != (char *)0x0) {
          addenv((cgi_env_block *)&st_1,"CONTENT_LENGTH=%s",pcVar10);
        }
        addenv2((cgi_env_block *)&st_1,"PATH");
        addenv2((cgi_env_block *)&st_1,"TMP");
        addenv2((cgi_env_block *)&st_1,"TEMP");
        addenv2((cgi_env_block *)&st_1,"TMPDIR");
        addenv2((cgi_env_block *)&st_1,"PERLLIB");
        addenv2((cgi_env_block *)&st_1,"MONGOOSE_CGI");
        addenv2((cgi_env_block *)&st_1,"LD_LIBRARY_PATH");
        if (c->num_headers < 1) {
LAB_00108762:
          lVar20 = (long)local_3e30._4_4_;
          local_3e30._4_4_ = local_3e30._4_4_ + 1;
          local_4030[lVar20] = 0;
          lVar20 = (long)(int)(uint)local_3e30;
          local_3e30._0_4_ = (uint)local_3e30 + 1;
          *(undefined1 *)((long)st_1.__glibc_reserved + lVar20 + -0x70) = 0;
          if (0x3f < local_3e30._4_4_) {
            __assert_fail("blk->nvars < (int) ARRAY_SIZE(blk->vars)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ProjetoHotSpot[P]UaiFai/lib/mongoose.c"
                          ,0x889,
                          "void prepare_cgi_environment(struct connection *, const char *, struct cgi_env_block *)"
                         );
          }
          if ((int)(uint)local_3e30 < 1) {
            __assert_fail("blk->len > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ProjetoHotSpot[P]UaiFai/lib/mongoose.c"
                          ,0x88a,
                          "void prepare_cgi_environment(struct connection *, const char *, struct cgi_env_block *)"
                         );
          }
          if (0x1fff < (uint)local_3e30) {
            __assert_fail("blk->len < (int) sizeof(blk->buf)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ProjetoHotSpot[P]UaiFai/lib/mongoose.c"
                          ,0x88b,
                          "void prepare_cgi_environment(struct connection *, const char *, struct cgi_env_block *)"
                         );
          }
          pcVar10 = strrchr(path,0x2f);
          if (pcVar10 == (char *)0x0) {
            mg_snprintf(size,0x2000,"%s",".");
          }
          else {
            mg_snprintf(size,0x2000,"%.*s",(ulong)(uint)((int)pcVar10 - (int)path));
          }
          do {
            ns_socketpair2(&minute,1);
          } while (minute == -1);
          pcVar10 = *(char **)(c[1].request_method + 0x50);
          _Var7 = fork();
          if (_Var7 != 0) {
            *(undefined4 *)&c[1].http_version = 2;
            pnVar14 = ns_add_sock((ns_mgr *)c[1].request_method,minute,mg_ev_handler,local_a260);
            c[1].uri = (char *)pnVar14;
            pbVar13 = (byte *)((long)&pnVar14->flags + 2);
            *pbVar13 = *pbVar13 | 0x40;
            ns_out((ns_connection *)c[-1].callback_param,"HTTP/1.1 200 OK\r\n",0x11);
            c->status_code = 200;
            pvVar3 = c[-1].callback_param;
            *(uint *)((long)pvVar3 + 0x98) = *(uint *)((long)pvVar3 + 0x98) | 2;
            pcVar10 = c[1].uri;
            uVar5 = *(undefined8 *)((long)pvVar3 + 0x40);
            *(undefined8 *)(pcVar10 + 0x50) = *(undefined8 *)((long)pvVar3 + 0x38);
            *(undefined8 *)(pcVar10 + 0x58) = uVar5;
            *(undefined8 *)(pcVar10 + 0x60) = *(undefined8 *)((long)pvVar3 + 0x48);
            pvVar3 = c[-1].callback_param;
            *(undefined8 *)((long)pvVar3 + 0x38) = 0;
            *(undefined8 *)((long)pvVar3 + 0x40) = 0;
            *(undefined8 *)((long)pvVar3 + 0x48) = 0;
            iobuf_resize((iobuf *)((long)pvVar3 + 0x38),0);
            close(iStack_a24c);
            return;
          }
          chdir(size);
          dup2(iStack_a24c,0);
          dup2(iStack_a24c,1);
          close(iStack_a24c);
          __sysv_signal(0x11,(__sighandler_t)0x0);
          if (pcVar10 == (char *)0x0) {
            execle(path,path,0,local_4030);
            pcVar10 = "";
          }
          else {
            execle(pcVar10,pcVar10,path,0,local_4030);
            local_a258 = " ";
          }
          piVar15 = __errno_location();
          pcVar17 = strerror(*piVar15);
          snprintf(mod,500,"Status: 500\r\n\r\n500 Server Error: %s%s%s: %s",pcVar10,local_a258,path
                   ,pcVar17);
          sVar9 = strlen(mod);
          send(1,mod,sVar9,0);
          exit(1);
        }
        lVar20 = 0;
LAB_001086fb:
        pbVar13 = (byte *)addenv((cgi_env_block *)&st_1,"HTTP_%s=%s",c->http_headers[lVar20].name,
                                 c->http_headers[lVar20].value);
        do {
          bVar1 = *pbVar13;
          uVar19 = (ulong)bVar1;
          if (bVar1 == 0x2d) {
            *pbVar13 = 0x5f;
            uVar19 = 0x5f;
          }
          else if ((bVar1 == 0) || (bVar1 == 0x3d)) goto LAB_0010874f;
          pp_Var11 = __ctype_toupper_loc();
          *pbVar13 = *(byte *)(*pp_Var11 + uVar19);
          pbVar13 = pbVar13 + 1;
        } while( true );
      }
      pcVar10 = *(char **)(c[1].request_method + 0xb8);
      sVar9 = strlen(pcVar10);
      iVar6 = mg_match_prefix(pcVar10,(int)sVar9,path);
      conn_00 = local_a260;
      if (0 < iVar6) {
        __stream = fopen64(path,"rb");
        if (__stream == (FILE *)0x0) {
          piVar15 = __errno_location();
          pcVar10 = strerror(*piVar15);
          send_http_error(conn_00,500,"fopen(%s): %s",path,pcVar10);
          return;
        }
        iVar6 = fileno(__stream);
        fcntl64(iVar6,2,1);
        get_mime_type(*(mg_server **)(c[1].request_method + 0x80),path,(vec *)&st_1);
        c->status_code = 200;
        mg_printf(c,"HTTP/1.1 %d OK\r\nContent-Type: %.*s\r\nConnection: close\r\n\r\n",200,
                  (ulong)(uint)st_1.st_ino,st_1.st_dev);
        send_ssi_file(c,path,(FILE *)__stream,0);
        fclose(__stream);
        goto LAB_00108d31;
      }
      pcVar10 = mg_get_header(c,"If-Modified-Since");
      pcVar17 = mg_get_header(c,"If-None-Match");
      mg_snprintf((char *)&st_1,0x40,"\"%lx.%ld\"",local_a248->st_mtime,local_a248->st_size);
      if (pcVar17 != (char *)0x0) {
        pp_Var11 = __ctype_tolower_loc();
        lVar20 = 0;
        do {
          bVar1 = *(byte *)((long)st_1.__glibc_reserved + lVar20 + -0x78);
          iVar6 = (*pp_Var11)[bVar1];
          iVar2 = (*pp_Var11)[(byte)pcVar17[lVar20]];
          if (bVar1 == 0) break;
          lVar20 = lVar20 + 1;
        } while (iVar6 == iVar2);
        if (iVar6 != iVar2) goto LAB_0010898c;
LAB_00108e25:
        iVar6 = 0x130;
        conn_00 = local_a260;
        goto LAB_001080ac;
      }
LAB_0010898c:
      if (pcVar10 != (char *)0x0) {
        pcVar17 = (char *)local_a248->st_mtime;
        iVar6 = __isoc99_sscanf(pcVar10,"%d/%3s/%d %d:%d:%d",&day,size,&local_a26c,&hour,&minute,mod
                               );
        if (((iVar6 == 6) ||
            (iVar6 = __isoc99_sscanf(pcVar10,"%d %3s %d %d:%d:%d",&day,size,&local_a26c,&hour,
                                     &minute,mod), iVar6 == 6)) ||
           (iVar6 = __isoc99_sscanf(pcVar10,"%*3s, %d %3s %d %d:%d:%d",&day,size,&local_a26c,&hour,
                                    &minute,mod), iVar6 == 6)) {
          if (0x7b2 < local_a26c) goto LAB_00108a5a;
          lVar20 = 0;
        }
        else {
          lVar20 = 0;
          iVar6 = __isoc99_sscanf(pcVar10,"%d-%3s-%d %d:%d:%d",&day,size,&local_a26c,&hour,&minute,
                                  mod);
          if (iVar6 == 6 && 0x7b2 < local_a26c) {
LAB_00108a5a:
            lVar20 = 0;
            lVar16 = 0;
            piVar15 = &get_month_index_month_names_rel;
            local_a258 = pcVar17;
            do {
              iVar6 = strcmp(size,(char *)((long)&get_month_index_month_names_rel + (long)*piVar15))
              ;
              pcVar17 = local_a258;
              if (iVar6 == 0) {
                iVar6 = local_a26c + 3;
                if (-1 < local_a26c) {
                  iVar6 = local_a26c;
                }
                iVar2 = (int)((ulong)((long)local_a26c * -0x51eb851f) >> 0x20);
                lVar20 = (long)(int)mod._0_4_ + (long)minute * 0x3c + (long)hour * 0xe10 +
                         (long)(int)(((uint)*(ushort *)
                                             ((long)&parse_date_string_days_before_month + lVar16) +
                                      local_a26c / 400 +
                                      local_a26c * 0x16d + (iVar6 >> 2) +
                                      ((iVar2 >> 5) - (iVar2 >> 0x1f)) + day) * 0x15180 +
                                    -0x79747c00);
                break;
              }
              piVar15 = piVar15 + 1;
              lVar16 = lVar16 + 2;
            } while (lVar16 != 0x18);
          }
        }
        if ((long)pcVar17 <= lVar20) goto LAB_00108e25;
      }
      conn_00 = local_a260;
      iVar6 = open64(path,0,0);
      *(int *)&c[1].uri = iVar6;
      if (iVar6 != -1) {
        open_file_endpoint(conn_00,path,local_a248,local_a240);
        return;
      }
    }
  }
  iVar6 = 0x194;
LAB_001080ac:
  send_http_error(conn_00,iVar6,(char *)0x0);
  return;
LAB_0010874f:
  lVar20 = lVar20 + 1;
  if (c->num_headers <= lVar20) goto LAB_00108762;
  goto LAB_001086fb;
}

Assistant:

void mg_send_file_internal(struct mg_connection *c, const char *file_name,
                           file_stat_t *st, int exists,
                           const char *extra_headers) {
  struct connection *conn = MG_CONN_2_CONN(c);
  char path[MAX_PATH_SIZE];
  const int is_directory = S_ISDIR(st->st_mode);
#ifndef MONGOOSE_NO_CGI
  const char *cgi_pat = conn->server->config_options[CGI_PATTERN];
#else
  const char *cgi_pat = DEFAULT_CGI_PATTERN;
#endif
#ifndef MONGOOSE_NO_DIRECTORY_LISTING
  const char *dir_lst = conn->server->config_options[ENABLE_DIRECTORY_LISTING];
#else
  const char *dir_lst = "yes";
#endif

  mg_snprintf(path, sizeof(path), "%s", file_name);

  if (!exists || must_hide_file(conn, path)) {
    send_http_error(conn, 404, NULL);
  } else if (is_directory &&
             conn->mg_conn.uri[strlen(conn->mg_conn.uri) - 1] != '/') {
    conn->mg_conn.status_code = 301;
    mg_printf(&conn->mg_conn, "HTTP/1.1 301 Moved Permanently\r\n"
              "Location: %s/\r\n\r\n", conn->mg_conn.uri);
    close_local_endpoint(conn);
  } else if (is_directory && !find_index_file(conn, path, sizeof(path), st)) {
    if (!mg_strcasecmp(dir_lst, "yes")) {
#ifndef MONGOOSE_NO_DIRECTORY_LISTING
      send_directory_listing(conn, path);
#else
      send_http_error(conn, 501, NULL);
#endif
    } else {
      send_http_error(conn, 403, NULL);
    }
  } else if (mg_match_prefix(cgi_pat, strlen(cgi_pat), path) > 0) {
#if !defined(MONGOOSE_NO_CGI)
    open_cgi_endpoint(conn, path);
#else
    send_http_error(conn, 501, NULL);
#endif // !MONGOOSE_NO_CGI
#ifndef MONGOOSE_NO_SSI
  } else if (mg_match_prefix(conn->server->config_options[SSI_PATTERN],
                             strlen(conn->server->config_options[SSI_PATTERN]),
                             path) > 0) {
    handle_ssi_request(conn, path);
#endif
  } else if (is_not_modified(conn, st)) {
    send_http_error(conn, 304, NULL);
  } else if ((conn->endpoint.fd = open(path, O_RDONLY | O_BINARY, 0)) != -1) {
    // O_BINARY is required for Windows, otherwise in default text mode
    // two bytes \r\n will be read as one.
    open_file_endpoint(conn, path, st, extra_headers);
  } else {
    send_http_error(conn, 404, NULL);
  }
}